

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.cpp
# Opt level: O2

void Js::ConfigFlagsTable::PrintUsageString(void)

{
  code *pcVar1;
  bool bVar2;
  FlagTypes FVar3;
  undefined4 *puVar4;
  char16_t *form;
  int i;
  ulong uVar5;
  undefined **ppuVar6;
  long lVar7;
  
  Output::Print(L"List of Phases:\n");
  for (uVar5 = 0; uVar5 != 0x175; uVar5 = uVar5 + 1) {
    if ((uVar5 & 3) == 0) {
      Output::Print(L"\n  ");
    }
    Output::Print(L"%-40ls ",(&PhaseNames)[uVar5]);
  }
  Output::Print(L"\n\nList of flags:\n\n");
  ppuVar6 = &FlagDescriptions;
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  lVar7 = 0;
  do {
    if (lVar7 == 0x1d6) {
      return;
    }
    Output::Print(L"%60ls ",(&FlagNames)[lVar7]);
    FVar3 = GetFlagType((Flag)lVar7);
    switch(FVar3) {
    case InvalidFlagType:
      goto switchD_0034b738_caseD_0;
    case FlagString:
      form = L"[:String]        ";
      break;
    case FlagPhases:
      form = L"[:Phase]         ";
      break;
    case FlagNumber:
      form = L"[:Number]        ";
      break;
    case FlagBoolean:
      form = L"                 ";
      break;
    case FlagNumberSet:
      form = L"[:NumberSet]     ";
      break;
    case FlagNumberPairSet:
      form = L"[:NumberPairSet] ";
      break;
    case FlagNumberTrioSet:
      form = L"[:NumberTrioSet] ";
      break;
    case FlagNumberRange:
      form = L"[:NumberRange]   ";
      break;
    default:
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ConfigFlagsTable.cpp"
                                  ,0x398,"(false)","false");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
      goto switchD_0034b738_caseD_0;
    }
    Output::Print(form);
switchD_0034b738_caseD_0:
    Output::Print(L"%ls\n",*ppuVar6);
    lVar7 = lVar7 + 1;
    ppuVar6 = ppuVar6 + 1;
  } while( true );
}

Assistant:

void
    ConfigFlagsTable::PrintUsageString()
    {
        Output::Print(_u("List of Phases:\n"));
        for(int i = 0; i < PhaseCount; i++)
        {
            if (i % 4 == 0)
            {
                Output::Print(_u("\n  "));
            }
            Output::Print(_u("%-40ls "), PhaseNames[i]);
        }

        Output::Print(_u("\n\nList of flags:\n\n"));
        for(int i = 0; i < FlagCount; i++)
        {
            Output::Print(_u("%60ls "), FlagNames[i]);
            switch(GetFlagType(Flag(i)))
            {
            case InvalidFlagType:
                break;
            case FlagString:
                Output::Print(_u("[:String]        "));
                break;
            case FlagPhases:
                Output::Print(_u("[:Phase]         "));
                break;
            case FlagNumber:
                Output::Print(_u("[:Number]        "));
                break;
            case FlagBoolean:
                Output::Print(_u("                 "));
                break;
            case FlagNumberSet:
                Output::Print(_u("[:NumberSet]     "));
                break;
            case FlagNumberPairSet:
                Output::Print(_u("[:NumberPairSet] "));
                break;
            case FlagNumberTrioSet:
                Output::Print(_u("[:NumberTrioSet] "));
                break;
            case FlagNumberRange:
                Output::Print(_u("[:NumberRange]   "));
                break;
            default:
                Assert(false);
                __assume(false);
            }
            Output::Print(_u("%ls\n"), FlagDescriptions[i]);
        }
    }